

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::DescriptorPoolExtensionFinder::Find
          (DescriptorPoolExtensionFinder *this,int number,ExtensionInfo *output)

{
  MessageFactory *pMVar1;
  Type TVar2;
  CppType CVar3;
  int iVar4;
  FieldDescriptor *this_00;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  LogMessage *pLVar6;
  EnumDescriptor *pEVar7;
  LogFinisher local_51;
  LogMessage local_50;
  
  this_00 = DescriptorPool::FindExtensionByNumber(this->pool_,this->containing_type_,number);
  if (this_00 != (FieldDescriptor *)0x0) {
    TVar2 = FieldDescriptor::type(this_00);
    output->type = (FieldType)TVar2;
    output->is_repeated = *(int *)(this_00 + 0x4c) == 3;
    output->is_packed = *(bool *)(*(long *)(this_00 + 0x80) + 0x6c);
    output->descriptor = this_00;
    CVar3 = FieldDescriptor::cpp_type(this_00);
    if (CVar3 == CPPTYPE_MESSAGE) {
      pMVar1 = this->factory_;
      pDVar5 = FieldDescriptor::message_type(this_00);
      iVar4 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar5);
      (output->field_3).enum_validity_check.func =
           (EnumValidityFuncWithArg *)CONCAT44(extraout_var,iVar4);
      if ((EnumValidityFuncWithArg *)CONCAT44(extraout_var,iVar4) == (EnumValidityFuncWithArg *)0x0)
      {
        LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x12d);
        pLVar6 = LogMessage::operator<<
                           (&local_50,"CHECK failed: output->message_prototype != NULL: ");
        pLVar6 = LogMessage::operator<<
                           (pLVar6,
                            "Extension factory\'s GetPrototype() returned NULL for extension: ");
        pLVar6 = LogMessage::operator<<(pLVar6,*(string **)(this_00 + 8));
        LogFinisher::operator=(&local_51,pLVar6);
        LogMessage::~LogMessage(&local_50);
      }
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(this_00);
      if (CVar3 == CPPTYPE_ENUM) {
        (output->field_3).enum_validity_check.func = ValidateEnumUsingDescriptor;
        pEVar7 = FieldDescriptor::enum_type(this_00);
        (output->field_3).enum_validity_check.arg = pEVar7;
      }
    }
  }
  return this_00 != (FieldDescriptor *)0x0;
}

Assistant:

bool DescriptorPoolExtensionFinder::Find(int number, ExtensionInfo* output) {
  const FieldDescriptor* extension =
      pool_->FindExtensionByNumber(containing_type_, number);
  if (extension == NULL) {
    return false;
  } else {
    output->type = extension->type();
    output->is_repeated = extension->is_repeated();
    output->is_packed = extension->options().packed();
    output->descriptor = extension;
    if (extension->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      output->message_prototype =
          factory_->GetPrototype(extension->message_type());
      GOOGLE_CHECK(output->message_prototype != NULL)
          << "Extension factory's GetPrototype() returned NULL for extension: "
          << extension->full_name();
    } else if (extension->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      output->enum_validity_check.func = ValidateEnumUsingDescriptor;
      output->enum_validity_check.arg = extension->enum_type();
    }

    return true;
  }
}